

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void __thiscall QDateTime::setMSecsSinceEpoch(QDateTime *this,qint64 msecs)

{
  QDateTimePrivate *pQVar1;
  undefined8 uVar2;
  QDateTimePrivate *pQVar3;
  QDateTimePrivate *pQVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  Int IVar8;
  uint uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  ZoneState local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (this->d).d;
  if (((ulong)pQVar4 & 1) == 0) {
    IVar8 = (pQVar4->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    IVar8 = (Int)(byte)pQVar4;
  }
  uVar5 = IVar8 >> 4 & 3;
  uVar9 = IVar8 & 0xfffffff1;
  if (uVar5 - 1 < 2) {
    local_50.offset = 0;
    if (uVar5 == 2) {
      iVar7 = pQVar4->m_offsetFromUtc;
      local_50.offset = 0;
      if (((long)iVar7 != 0) &&
         (lVar6 = (long)iVar7 * 1000, bVar10 = SCARRY8(msecs,lVar6), msecs = msecs + lVar6,
         local_50.offset = iVar7, bVar10)) goto LAB_001644d6;
    }
LAB_001644c5:
    uVar9 = IVar8 | 0xe;
    iVar7 = local_50.offset;
  }
  else {
    iVar7 = 0;
    if ((uVar5 == 0) &&
       (QDateTimePrivate::expressUtcAsLocal(&local_50,msecs), msecs = local_50.when,
       iVar7 = local_50.offset, (local_50.valid & 1U) != 0)) {
      IVar8 = IVar8 & 0xffffff31;
      if (local_50.dst == StandardTime) {
        uVar9 = IVar8 | 0x4e;
      }
      else {
        if (local_50.dst != DaylightTime) goto LAB_001644c5;
        uVar9 = IVar8 | 0x8e;
      }
    }
  }
LAB_001644d6:
  pQVar4 = (this->d).d;
  if (msecs + 0x80000000000000U >> 0x38 == 0) {
    if (((ulong)pQVar4 & 1) != 0) {
      (this->d).d = (QDateTimePrivate *)((ulong)(uVar9 & 0xff) | msecs << 8);
      goto LAB_001645d0;
    }
LAB_0016450b:
    if ((__int_type)
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      pQVar3 = (QDateTimePrivate *)operator_new(0x20);
      (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      uVar2 = *(undefined8 *)((long)&pQVar4->m_msecs + 4);
      *(undefined8 *)&pQVar3->m_status = *(undefined8 *)&pQVar4->m_status;
      *(undefined8 *)((long)&pQVar3->m_msecs + 4) = uVar2;
      QTimeZone::QTimeZone(&pQVar3->m_timeZone,&pQVar4->m_timeZone);
      (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
      pQVar1 = (this->d).d;
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      pQVar4 = pQVar3;
      if ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> == 0) {
        pQVar1 = (this->d).d;
        if (pQVar1 != (QDateTimePrivate *)0x0) {
          QTimeZone::~QTimeZone(&pQVar1->m_timeZone);
        }
        operator_delete(pQVar1,0x20);
      }
      goto LAB_001645b4;
    }
  }
  else {
    if (((ulong)pQVar4 & 1) == 0) goto LAB_0016450b;
    pQVar4 = (QDateTimePrivate *)operator_new(0x20);
    pQVar4->super_QSharedData = (QAtomicInt)0x0;
    pQVar4->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
    pQVar4->m_msecs = 0;
    pQVar4->m_offsetFromUtc = 0;
    QTimeZone::QTimeZone(&pQVar4->m_timeZone);
    pQVar1 = (this->d).d;
    (pQVar4->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (int)(char)pQVar1 & 0xfffffffe;
    pQVar4->m_msecs = (long)pQVar1 >> 8;
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 1;
LAB_001645b4:
    (this->d).d = pQVar4;
  }
  (pQVar4->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar9 & 0xfffffffe;
  ((this->d).d)->m_msecs = msecs;
  ((this->d).d)->m_offsetFromUtc = iVar7;
LAB_001645d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTime::setMSecsSinceEpoch(qint64 msecs)
{
    auto status = getStatus(d);
    const auto spec = extractSpec(status);
    Q_ASSERT(specCanBeSmall(spec) || !d.isShort());
    QDateTimePrivate::ZoneState state(msecs);

    status &= ~QDateTimePrivate::ValidityMask;
    if (QTimeZone::isUtcOrFixedOffset(spec)) {
        if (spec == Qt::OffsetFromUTC)
            state.offset = d->m_offsetFromUtc;
        if (!state.offset || !qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))
            status |= QDateTimePrivate::ValidityMask;
    } else if (spec == Qt::LocalTime) {
        state = QDateTimePrivate::expressUtcAsLocal(msecs);
        if (state.valid)
            status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask, state.dst);
#if QT_CONFIG(timezone)
    } else if (spec == Qt::TimeZone && (d.detach(), d->m_timeZone.isValid())) {
        const auto data = d->m_timeZone.d->data(msecs);
        if (Q_LIKELY(data.offsetFromUtc != QTimeZonePrivate::invalidSeconds())) {
            state.offset = data.offsetFromUtc;
            Q_ASSERT(state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY);
            if (!state.offset
                || !Q_UNLIKELY(qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))) {
                d->m_status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask,
                                                  data.daylightTimeOffset
                                                  ? QDateTimePrivate::DaylightTime
                                                  : QDateTimePrivate::StandardTime);
                d->m_msecs = state.when;
                d->m_offsetFromUtc = state.offset;
                return;
            } // else: zone can't represent this UTC time
        } // else: zone unable to represent given UTC time (should only happen on overflow).
#endif // timezone
    }
    Q_ASSERT(!status.testFlag(QDateTimePrivate::ValidDateTime)
             || (state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY));

    if (msecsCanBeSmall(state.when) && d.isShort()) {
        // we can keep short
        d.data.msecs = qintptr(state.when);
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_msecs = state.when;
        d->m_offsetFromUtc = state.offset;
    }
}